

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::makeindex2pointmap(tetgenmesh *this,point **idx2verlist)

{
  memorypool *pmVar1;
  void **ppvVar2;
  point *ppdVar3;
  point pdVar4;
  long lVar5;
  
  if (1 < this->b->verbose) {
    puts("  Constructing mapping from indices to points.");
  }
  lVar5 = this->points->items;
  ppdVar3 = (point *)operator_new__(-(ulong)(lVar5 + 1U >> 0x3d != 0) | lVar5 * 8 + 8U);
  *idx2verlist = ppdVar3;
  pmVar1 = this->points;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  do {
    pdVar4 = (point)memorypool::traverse(this->points);
    if (pdVar4 == (point)0x0) {
      pdVar4 = (point)0x0;
      break;
    }
  } while ((*(uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  if (pdVar4 != (point)0x0) {
    lVar5 = (long)this->in->firstnumber;
    do {
      (*idx2verlist)[lVar5] = pdVar4;
      lVar5 = lVar5 + 1;
      do {
        pdVar4 = (point)memorypool::traverse(this->points);
        if (pdVar4 == (point)0x0) {
          pdVar4 = (point)0x0;
          break;
        }
      } while ((*(uint *)((long)pdVar4 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00)
      ;
    } while (pdVar4 != (point)0x0);
  }
  return;
}

Assistant:

void tetgenmesh::makeindex2pointmap(point*& idx2verlist)
{
  point pointloop;
  int idx;

  if (b->verbose > 1) {
    printf("  Constructing mapping from indices to points.\n");
  }

  idx2verlist = new point[points->items + 1];

  points->traversalinit();
  pointloop = pointtraverse();
  idx =  in->firstnumber;
  while (pointloop != (point) NULL) {
    idx2verlist[idx++] = pointloop;
    pointloop = pointtraverse();
  }
}